

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::showNormal(QWidget *this)

{
  QFlagsStorage<Qt::WindowState> QVar1;
  QFlagsStorage<Qt::WindowState> QVar2;
  QFlags<Qt::WindowState> other;
  long *in_RDI;
  long in_FS_OFFSET;
  QFlagsStorage<Qt::WindowState> in_stack_00000014;
  enum_type in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar3;
  QWidget *this_00;
  
  this_00 = *(QWidget **)(in_FS_OFFSET + 0x28);
  ensurePolished(this_00);
  QVar1.i = (Int)windowState((QWidget *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  uVar3 = 1;
  Qt::operator|(WindowMinimized,in_stack_ffffffffffffffd0);
  QVar2.i = (Int)QFlags<Qt::WindowState>::operator|
                           ((QFlags<Qt::WindowState> *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                            (WindowState)((ulong)in_RDI >> 0x20));
  other = QFlags<Qt::WindowState>::operator~
                    ((QFlags<Qt::WindowState> *)CONCAT44(uVar3,in_stack_ffffffffffffffd0));
  QFlags<Qt::WindowState>::operator&
            ((QFlags<Qt::WindowState> *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),other);
  setWindowState((QWidget *)CONCAT44(QVar1.i,QVar2.i),(WindowStates)in_stack_00000014.i);
  (**(code **)(*in_RDI + 0x68))(in_RDI,uVar3);
  if (*(QWidget **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::showNormal()
{
    ensurePolished();

    setWindowState(windowState() & ~(Qt::WindowMinimized
                                     | Qt::WindowMaximized
                                     | Qt::WindowFullScreen));
    setVisible(true);
}